

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::ValidPadding::ByteSizeLong(ValidPadding *this)

{
  bool bVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  ValidPadding *this_local;
  
  sStack_18 = 0;
  bVar1 = has_paddingamounts(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::BorderAmounts>(this->paddingamounts_);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t ValidPadding::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ValidPadding)
  size_t total_size = 0;

  // .CoreML.Specification.BorderAmounts paddingAmounts = 1;
  if (this->has_paddingamounts()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->paddingamounts_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}